

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

void showTestProgress(int at,int max,int nrTests)

{
  clock_t cVar1;
  clock_t tick;
  int nrTests_local;
  int max_local;
  int at_local;
  
  cVar1 = clock();
  if (cVar1 / 500000 != showTestProgress::prevTick) {
    showTestProgress::prevTick = cVar1 / 500000;
    fprintf(_stderr,"\r%0.1f%% (executed %0.1fM tests)\r",((double)at * 100.0) / (double)max,
            (double)nrTests / 1000000.0,cVar1 % 500000);
  }
  return;
}

Assistant:

static void showTestProgress(int at, int max, int nrTests) {
    static clock_t prevTick = 0;

    // No worries, clock() is a very fast call.
    clock_t tick = clock() / (CLOCKS_PER_SEC / 2);
    if (tick != prevTick) {
        prevTick = tick;

        // Use stderr to not pollute logs.
        fprintf(stderr, "\r%0.1f%% (executed %0.1fM tests)\r", (at * 100.0) / max, nrTests / 1000000.0);
    }
}